

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

bool __thiscall
basisu::basis_compressor::generate_mipmaps
          (basis_compressor *this,image *img,vector<basisu::image> *mips,bool has_alpha)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  value_type *this_00;
  uint uVar4;
  image *src;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  interval_timer tm;
  interval_timer local_48;
  
  debug_printf("basis_compressor::generate_mipmaps\n");
  interval_timer::interval_timer(&local_48);
  interval_timer::start(&local_48);
  uVar3 = img->m_width;
  uVar4 = img->m_height;
  uVar1 = (this->m_params).m_mip_smallest_dimension.m_value;
  uVar5 = uVar4;
  if (uVar4 < uVar3) {
    uVar5 = uVar3;
  }
  if (uVar1 < uVar5) {
    uVar5 = 1;
    do {
      uVar3 = (uVar3 >> 1) + (uint)(uVar3 >> 1 == 0);
      uVar4 = (uVar4 >> 1) + (uint)(uVar4 >> 1 == 0);
      uVar5 = uVar5 + 1;
      uVar6 = uVar4;
      if (uVar4 < uVar3) {
        uVar6 = uVar3;
      }
    } while (uVar1 < uVar6);
    if (1 < uVar5) {
      uVar8 = 1;
      lVar7 = 0;
      bVar9 = false;
      do {
        uVar3 = img->m_width >> ((byte)uVar8 & 0x1f);
        uVar4 = img->m_height >> ((byte)uVar8 & 0x1f);
        this_00 = enlarge_vector<basisu::vector<basisu::image>>(mips,1);
        image::crop(this_00,uVar3 + (uVar3 == 0),uVar4 + (uVar4 == 0),0xffffffff,
                    (color_rgba *)&g_black_color,true);
        src = img;
        if ((1 < uVar8) && ((this->m_params).m_mip_fast.m_value != false)) {
          if ((ulong)mips->m_size <= uVar8 - 1) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::image>::operator[](size_t) [T = basisu::image]"
                         );
          }
          src = (image *)((long)&mips->m_p->m_width + lVar7);
        }
        bVar2 = image_resample(src,this_00,(this->m_params).m_mip_srgb.m_value,
                               (this->m_params).m_mip_filter._M_dataplus._M_p,
                               (this->m_params).m_mip_scale.m_value,
                               (this->m_params).m_mip_wrapping.m_value,0,has_alpha + 3);
        if (!bVar2) {
          error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
          return bVar9;
        }
        if ((this->m_params).m_mip_renormalize.m_value == true) {
          image::renormalize_normal_map(this_00);
        }
        uVar8 = uVar8 + 1;
        bVar9 = uVar5 <= uVar8;
        lVar7 = lVar7 + 0x20;
      } while (uVar5 != uVar8);
    }
  }
  if ((this->m_params).m_debug.m_value == true) {
    interval_timer::get_elapsed_secs(&local_48);
    debug_printf("Total mipmap generation time: %3.3f secs\n");
  }
  return true;
}

Assistant:

bool basis_compressor::generate_mipmaps(const image &img, basisu::vector<image> &mips, bool has_alpha)
	{
		debug_printf("basis_compressor::generate_mipmaps\n");

		interval_timer tm;
		tm.start();

		uint32_t total_levels = 1;
		uint32_t w = img.get_width(), h = img.get_height();
		while (maximum<uint32_t>(w, h) > (uint32_t)m_params.m_mip_smallest_dimension)
		{
			w = maximum(w >> 1U, 1U);
			h = maximum(h >> 1U, 1U);
			total_levels++;
		}

#if BASISU_USE_STB_IMAGE_RESIZE_FOR_MIPMAP_GEN
		// Requires stb_image_resize
		stbir_filter filter = STBIR_FILTER_DEFAULT;
		if (m_params.m_mip_filter == "box")
			filter = STBIR_FILTER_BOX;
		else if (m_params.m_mip_filter == "triangle")
			filter = STBIR_FILTER_TRIANGLE;
		else if (m_params.m_mip_filter == "cubic")
			filter = STBIR_FILTER_CUBICBSPLINE;
		else if (m_params.m_mip_filter == "catmull")
			filter = STBIR_FILTER_CATMULLROM;
		else if (m_params.m_mip_filter == "mitchell")
			filter = STBIR_FILTER_MITCHELL;

		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image &level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);
						
			int result = stbir_resize_uint8_generic( 
				(const uint8_t *)img.get_ptr(), img.get_width(), img.get_height(), img.get_pitch() * sizeof(color_rgba),
            (uint8_t *)level_img.get_ptr(), level_img.get_width(), level_img.get_height(), level_img.get_pitch() * sizeof(color_rgba),
            has_alpha ? 4 : 3, has_alpha ? 3 : STBIR_ALPHA_CHANNEL_NONE, m_params.m_mip_premultiplied ? STBIR_FLAG_ALPHA_PREMULTIPLIED : 0,
            m_params.m_mip_wrapping ? STBIR_EDGE_WRAP : STBIR_EDGE_CLAMP, filter, m_params.m_mip_srgb ? STBIR_COLORSPACE_SRGB : STBIR_COLORSPACE_LINEAR, 
				nullptr);

			if (result == 0)
			{
				error_printf("basis_compressor::generate_mipmaps: stbir_resize_uint8_generic() failed!\n");
				return false;
			}
			
			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#else
		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image& level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);

			const image* pSource_image = &img;

			if (m_params.m_mip_fast)
			{
				if (level > 1)
					pSource_image = &mips[level - 1];
			}

			bool status = image_resample(*pSource_image, level_img, m_params.m_mip_srgb, m_params.m_mip_filter.c_str(), m_params.m_mip_scale, m_params.m_mip_wrapping, 0, has_alpha ? 4 : 3);
			if (!status)
			{
				error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
				return false;
			}

			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#endif

		if (m_params.m_debug)
			debug_printf("Total mipmap generation time: %3.3f secs\n", tm.get_elapsed_secs());

		return true;
	}